

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFExpression.cpp
# Opt level: O1

int __thiscall
llvm::DWARFExpression::verify
          (DWARFExpression *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen
          )

{
  iterator *this_00;
  int iVar1;
  ulong uVar2;
  uchar *sig_00;
  uchar *sig_01;
  int iVar3;
  undefined1 local_a8 [8];
  iterator __end1;
  iterator __begin1;
  undefined8 uVar4;
  
  this_00 = (iterator *)(__end1.Op.OperandEndOffsets + 1);
  iterator::iterator(this_00,this,0);
  iterator::iterator((iterator *)local_a8,this,(this->Data).Data.Length);
  uVar2 = (ulong)__end1.Expr ^ (ulong)__begin1.Expr |
          __end1.Op.OperandEndOffsets[1] ^ (ulong)local_a8;
  uVar4 = CONCAT71((int7)((ulong)this_00 >> 8),uVar2 == 0);
  iVar3 = (int)uVar4;
  if (uVar2 != 0) {
    iVar1 = Operation::verify((Operation *)&__begin1.Offset,ctx,sig_00,uVar2,tbs,tbslen);
    if ((char)iVar1 != '\0') {
      do {
        iterator::operator++((iterator *)(__end1.Op.OperandEndOffsets + 1));
        uVar2 = (ulong)__end1.Expr ^ (ulong)__begin1.Expr |
                __end1.Op.OperandEndOffsets[1] ^ (ulong)local_a8;
        uVar4 = CONCAT71((int7)((ulong)uVar4 >> 8),uVar2 == 0);
        iVar3 = (int)uVar4;
        if (uVar2 == 0) {
          return iVar3;
        }
        iVar1 = Operation::verify((Operation *)&__begin1.Offset,ctx,sig_01,uVar2,tbs,tbslen);
      } while ((char)iVar1 != '\0');
    }
  }
  return iVar3;
}

Assistant:

bool DWARFExpression::verify(DWARFUnit *U) {
  for (auto &Op : *this)
    if (!Op.verify(U))
      return false;

  return true;
}